

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void hamming_test(void)

{
  unsigned_long unaff_retaddr;
  int l;
  int k_1;
  int k;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  undefined4 in_stack_fffffffffffffff8;
  int iVar2;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  roaring_hamming(0xffffffffffffffff);
  _assert_true(unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 1) {
    roaring_hamming(1L << ((byte)iVar3 & 0x3f));
    _assert_true(unaff_retaddr,(char *)CONCAT44(iVar3,in_stack_fffffffffffffff8),
                 (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffec);
  }
  for (iVar2 = 0; iVar2 < 0x40; iVar2 = iVar2 + 1) {
    for (iVar1 = 0; iVar1 < 0x40; iVar1 = iVar1 + 1) {
      roaring_hamming(1L << ((byte)iVar2 & 0x3f) | 1L << ((byte)iVar1 & 0x3f));
      _assert_true(unaff_retaddr,(char *)CONCAT44(iVar3,iVar2),
                   (char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(hamming_test) {
    assert_true(roaring_hamming(0xffffffffffffffffULL) == 64);
    for (int k = 0; k < 64; k++) {
        assert_true(roaring_hamming(1ULL << k) == 1);
    }
    for (int k = 0; k < 64; k++) {
        for (int l = 0; l < 64; l++) {
            assert_true(roaring_hamming((1ULL << k) | (1ULL << l)) ==
                        2 - (k == l));
        }
    }
}